

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32x32_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  int iVar2;
  int in_ECX;
  int in_EDX;
  longlong *in_RSI;
  longlong *in_RDI;
  int in_R8D;
  uint in_R9D;
  uint extraout_XMM0_Da;
  uint uVar3;
  uint extraout_XMM0_Db;
  uint uVar4;
  uint extraout_XMM0_Dc;
  uint uVar5;
  uint extraout_XMM0_Dd;
  uint uVar6;
  __m128i offset;
  int log_range_out;
  __m128i bf1;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rounding;
  __m128i cospi32;
  int32_t *cospi;
  char local_290;
  int local_28c;
  undefined8 local_268;
  undefined8 uStack_260;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_22c;
  longlong local_228;
  longlong lStack_220;
  longlong local_218;
  longlong lStack_210;
  int32_t *local_200;
  uint local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  longlong *local_1e8;
  longlong *local_1e0;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int32_t local_19c;
  longlong local_198;
  longlong lStack_190;
  int32_t local_188;
  int32_t local_184;
  int32_t local_180;
  int32_t local_17c;
  longlong local_178;
  longlong lStack_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  
  local_1f8 = in_R9D;
  local_1f4 = in_R8D;
  local_1f0 = in_ECX;
  local_1ec = in_EDX;
  local_1e8 = in_RSI;
  local_1e0 = in_RDI;
  local_200 = cospi_arr(in_EDX);
  local_19c = local_200[0x20];
  local_218 = CONCAT44(local_19c,local_19c);
  lStack_210 = CONCAT44(local_19c,local_19c);
  local_1a0 = 1 << ((char)local_1ec - 1U & 0x1f);
  local_228 = CONCAT44(local_1a0,local_1a0);
  lStack_220 = CONCAT44(local_1a0,local_1a0);
  iVar2 = 8;
  if (local_1f0 != 0) {
    iVar2 = 6;
  }
  if (local_1f4 + iVar2 < 0x10) {
    local_28c = 0x10;
  }
  else {
    local_28c = 8;
    if (local_1f0 != 0) {
      local_28c = 6;
    }
    local_28c = local_1f4 + local_28c;
  }
  local_22c = local_28c;
  iVar2 = local_22c;
  local_22c._0_1_ = (char)local_28c;
  local_1a4 = -(1 << ((char)local_22c - 1U & 0x1f));
  local_1a8 = (1 << ((char)local_22c - 1U & 0x1f)) + -1;
  local_268 = *local_1e0;
  uStack_260 = local_1e0[1];
  local_22c = iVar2;
  local_198 = local_218;
  lStack_190 = lStack_210;
  local_188 = local_19c;
  local_184 = local_19c;
  local_180 = local_19c;
  local_17c = local_19c;
  local_178 = local_228;
  lStack_170 = lStack_220;
  local_168 = local_1a0;
  local_164 = local_1a0;
  local_160 = local_1a0;
  local_15c = local_1a0;
  local_148 = local_1a4;
  local_144 = local_1a4;
  local_140 = local_1a4;
  local_13c = local_1a4;
  local_128 = local_1a8;
  local_124 = local_1a8;
  local_120 = local_1a8;
  local_11c = local_1a8;
  local_248 = local_1a4;
  iStack_244 = local_1a4;
  local_158 = local_1a4;
  iStack_154 = local_1a4;
  iStack_240 = local_1a4;
  iStack_23c = local_1a4;
  iStack_150 = local_1a4;
  iStack_14c = local_1a4;
  local_258 = local_1a8;
  iStack_254 = local_1a8;
  local_138 = local_1a8;
  iStack_134 = local_1a8;
  iStack_250 = local_1a8;
  iStack_24c = local_1a8;
  iStack_130 = local_1a8;
  iStack_12c = local_1a8;
  half_btf_0_sse4_1((__m128i *)&local_218,(__m128i *)&local_268,(__m128i *)&local_228,local_1ec);
  if (local_1f0 == 0) {
    if (local_1f4 + 6 < 0x10) {
      local_290 = '\x10';
    }
    else {
      local_290 = (char)local_1f4 + '\x06';
    }
    local_248 = -(1 << (local_290 - 1U & 0x1f));
    local_258 = (1 << (local_290 - 1U & 0x1f)) + -1;
    iStack_244 = local_248;
    iStack_240 = local_248;
    iStack_23c = local_248;
    iStack_254 = local_258;
    iStack_250 = local_258;
    iStack_24c = local_258;
    local_268._0_4_ = extraout_XMM0_Da;
    local_268._4_4_ = extraout_XMM0_Db;
    uStack_260._0_4_ = extraout_XMM0_Dc;
    uStack_260._4_4_ = extraout_XMM0_Dd;
    if (local_1f8 != 0) {
      iVar2 = (1 << ((byte)local_1f8 & 0x1f)) >> 1;
      auVar1 = ZEXT416(local_1f8);
      local_268._0_4_ = (int)(extraout_XMM0_Da + iVar2) >> auVar1;
      local_268._4_4_ = (int)(extraout_XMM0_Db + iVar2) >> auVar1;
      uStack_260._0_4_ = (int)(extraout_XMM0_Dc + iVar2) >> auVar1;
      uStack_260._4_4_ = (int)(extraout_XMM0_Dd + iVar2) >> auVar1;
    }
  }
  else {
    uVar3 = (uint)((int)extraout_XMM0_Da < local_248) * local_248 |
            ((int)extraout_XMM0_Da >= local_248) * extraout_XMM0_Da;
    uVar4 = (uint)((int)extraout_XMM0_Db < iStack_244) * iStack_244 |
            ((int)extraout_XMM0_Db >= iStack_244) * extraout_XMM0_Db;
    uVar5 = (uint)((int)extraout_XMM0_Dc < iStack_240) * iStack_240 |
            ((int)extraout_XMM0_Dc >= iStack_240) * extraout_XMM0_Dc;
    uVar6 = (uint)((int)extraout_XMM0_Dd < iStack_23c) * iStack_23c |
            ((int)extraout_XMM0_Dd >= iStack_23c) * extraout_XMM0_Dd;
    local_268._0_4_ = (uint)(local_258 < (int)uVar3) * local_258 | (local_258 >= (int)uVar3) * uVar3
    ;
    local_268._4_4_ =
         (uint)(iStack_254 < (int)uVar4) * iStack_254 | (iStack_254 >= (int)uVar4) * uVar4;
    uStack_260._0_4_ =
         (uint)(iStack_250 < (int)uVar5) * iStack_250 | (iStack_250 >= (int)uVar5) * uVar5;
    uStack_260._4_4_ =
         (uint)(iStack_24c < (int)uVar6) * iStack_24c | (iStack_24c >= (int)uVar6) * uVar6;
  }
  uVar3 = (uint)((int)(uint)local_268 < local_248) * local_248 |
          ((int)(uint)local_268 >= local_248) * (uint)local_268;
  uVar4 = (uint)((int)local_268._4_4_ < iStack_244) * iStack_244 |
          ((int)local_268._4_4_ >= iStack_244) * local_268._4_4_;
  uVar5 = (uint)((int)(uint)uStack_260 < iStack_240) * iStack_240 |
          ((int)(uint)uStack_260 >= iStack_240) * (uint)uStack_260;
  uVar6 = (uint)((int)uStack_260._4_4_ < iStack_23c) * iStack_23c |
          ((int)uStack_260._4_4_ >= iStack_23c) * uStack_260._4_4_;
  local_268 = CONCAT44((uint)(iStack_254 < (int)uVar4) * iStack_254 |
                       (iStack_254 >= (int)uVar4) * uVar4,
                       (uint)(local_258 < (int)uVar3) * local_258 |
                       (local_258 >= (int)uVar3) * uVar3);
  uStack_260 = CONCAT44((uint)(iStack_24c < (int)uVar6) * iStack_24c |
                        (iStack_24c >= (int)uVar6) * uVar6,
                        (uint)(iStack_250 < (int)uVar5) * iStack_250 |
                        (iStack_250 >= (int)uVar5) * uVar5);
  *local_1e8 = local_268;
  local_1e8[1] = uStack_260;
  local_1e8[2] = local_268;
  local_1e8[3] = uStack_260;
  local_1e8[4] = local_268;
  local_1e8[5] = uStack_260;
  local_1e8[6] = local_268;
  local_1e8[7] = uStack_260;
  local_1e8[8] = local_268;
  local_1e8[9] = uStack_260;
  local_1e8[10] = local_268;
  local_1e8[0xb] = uStack_260;
  local_1e8[0xc] = local_268;
  local_1e8[0xd] = uStack_260;
  local_1e8[0xe] = local_268;
  local_1e8[0xf] = uStack_260;
  local_1e8[0x10] = local_268;
  local_1e8[0x11] = uStack_260;
  local_1e8[0x12] = local_268;
  local_1e8[0x13] = uStack_260;
  local_1e8[0x14] = local_268;
  local_1e8[0x15] = uStack_260;
  local_1e8[0x16] = local_268;
  local_1e8[0x17] = uStack_260;
  local_1e8[0x18] = local_268;
  local_1e8[0x19] = uStack_260;
  local_1e8[0x1a] = local_268;
  local_1e8[0x1b] = uStack_260;
  local_1e8[0x1c] = local_268;
  local_1e8[0x1d] = uStack_260;
  local_1e8[0x1e] = local_268;
  local_1e8[0x1f] = uStack_260;
  local_1e8[0x20] = local_268;
  local_1e8[0x21] = uStack_260;
  local_1e8[0x22] = local_268;
  local_1e8[0x23] = uStack_260;
  local_1e8[0x24] = local_268;
  local_1e8[0x25] = uStack_260;
  local_1e8[0x26] = local_268;
  local_1e8[0x27] = uStack_260;
  local_1e8[0x28] = local_268;
  local_1e8[0x29] = uStack_260;
  local_1e8[0x2a] = local_268;
  local_1e8[0x2b] = uStack_260;
  local_1e8[0x2c] = local_268;
  local_1e8[0x2d] = uStack_260;
  local_1e8[0x2e] = local_268;
  local_1e8[0x2f] = uStack_260;
  local_1e8[0x30] = local_268;
  local_1e8[0x31] = uStack_260;
  local_1e8[0x32] = local_268;
  local_1e8[0x33] = uStack_260;
  local_1e8[0x34] = local_268;
  local_1e8[0x35] = uStack_260;
  local_1e8[0x36] = local_268;
  local_1e8[0x37] = uStack_260;
  local_1e8[0x38] = local_268;
  local_1e8[0x39] = uStack_260;
  local_1e8[0x3a] = local_268;
  local_1e8[0x3b] = uStack_260;
  local_1e8[0x3c] = local_268;
  local_1e8[0x3d] = uStack_260;
  local_1e8[0x3e] = local_268;
  local_1e8[0x3f] = uStack_260;
  return;
}

Assistant:

static void idct32x32_low1_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rounding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i bf1;

  // stage 0
  // stage 1
  bf1 = in[0];

  // stage 2
  // stage 3
  // stage 4
  // stage 5
  bf1 = half_btf_0_sse4_1(&cospi32, &bf1, &rounding, bit);

  // stage 6
  // stage 7
  // stage 8
  // stage 9
  if (do_cols) {
    bf1 = _mm_max_epi32(bf1, clamp_lo);
    bf1 = _mm_min_epi32(bf1, clamp_hi);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    if (out_shift != 0) {
      __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
      bf1 = _mm_add_epi32(bf1, offset);
      bf1 = _mm_sra_epi32(bf1, _mm_cvtsi32_si128(out_shift));
    }
  }

  bf1 = _mm_max_epi32(bf1, clamp_lo);
  bf1 = _mm_min_epi32(bf1, clamp_hi);
  out[0] = bf1;
  out[1] = bf1;
  out[2] = bf1;
  out[3] = bf1;
  out[4] = bf1;
  out[5] = bf1;
  out[6] = bf1;
  out[7] = bf1;
  out[8] = bf1;
  out[9] = bf1;
  out[10] = bf1;
  out[11] = bf1;
  out[12] = bf1;
  out[13] = bf1;
  out[14] = bf1;
  out[15] = bf1;
  out[16] = bf1;
  out[17] = bf1;
  out[18] = bf1;
  out[19] = bf1;
  out[20] = bf1;
  out[21] = bf1;
  out[22] = bf1;
  out[23] = bf1;
  out[24] = bf1;
  out[25] = bf1;
  out[26] = bf1;
  out[27] = bf1;
  out[28] = bf1;
  out[29] = bf1;
  out[30] = bf1;
  out[31] = bf1;
}